

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_pointer.hpp
# Opt level: O1

basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
* __thiscall
nlohmann::json_abi_v3_11_2::json_pointer<std::__cxx11::string>::
get_checked<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          (json_pointer<std::__cxx11::string> *this,
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          *ptr)

{
  string_t *psVar1;
  int iVar2;
  size_type idx;
  out_of_range *poVar3;
  char (*in_R8) [18];
  string_t *s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  string local_48;
  
  s = *(string_t **)this;
  psVar1 = *(string_t **)(this + 8);
  do {
    if (s == psVar1) {
      return ptr;
    }
    if (ptr->m_type == array) {
      iVar2 = std::__cxx11::string::compare((char *)s);
      if (iVar2 == 0) {
        poVar3 = (out_of_range *)__cxa_allocate_exception(0x20);
        std::__cxx11::to_string
                  (&local_48,
                   (long)(((ptr->m_value).array)->
                         super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(((ptr->m_value).array)->
                         super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start >> 4);
        detail::
        concat<std::__cxx11::string,char_const(&)[18],std::__cxx11::string,char_const(&)[18]>
                  (&bStack_68,(detail *)"array index \'-\' (",(char (*) [18])&local_48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ") is out of range",in_R8);
        detail::out_of_range::
        create<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_*,_0>
                  (poVar3,0x192,&bStack_68,ptr);
        __cxa_throw(poVar3,&detail::out_of_range::typeinfo,detail::exception::~exception);
      }
      idx = array_index<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                      (s);
      ptr = basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::at(ptr,idx);
    }
    else {
      if (ptr->m_type != object) {
        poVar3 = (out_of_range *)__cxa_allocate_exception(0x20);
        detail::
        concat<std::__cxx11::string,char_const(&)[29],std::__cxx11::string_const&,char_const(&)[2]>
                  (&bStack_68,(detail *)"unresolved reference token \'",(char (*) [29])s,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x14232a,
                   (char (*) [2])in_R8);
        detail::out_of_range::
        create<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_*,_0>
                  (poVar3,0x194,&bStack_68,ptr);
        __cxa_throw(poVar3,&detail::out_of_range::typeinfo,detail::exception::~exception);
      }
      ptr = basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::at(ptr,s);
    }
    s = s + 1;
  } while( true );
}

Assistant:

BasicJsonType& get_checked(BasicJsonType* ptr) const
    {
        for (const auto& reference_token : reference_tokens)
        {
            switch (ptr->type())
            {
                case detail::value_t::object:
                {
                    // note: at performs range check
                    ptr = &ptr->at(reference_token);
                    break;
                }

                case detail::value_t::array:
                {
                    if (JSON_HEDLEY_UNLIKELY(reference_token == "-"))
                    {
                        // "-" always fails the range check
                        JSON_THROW(detail::out_of_range::create(402, detail::concat(
                                "array index '-' (", std::to_string(ptr->m_value.array->size()),
                                ") is out of range"), ptr));
                    }

                    // note: at performs range check
                    ptr = &ptr->at(array_index<BasicJsonType>(reference_token));
                    break;
                }

                case detail::value_t::null:
                case detail::value_t::string:
                case detail::value_t::boolean:
                case detail::value_t::number_integer:
                case detail::value_t::number_unsigned:
                case detail::value_t::number_float:
                case detail::value_t::binary:
                case detail::value_t::discarded:
                default:
                    JSON_THROW(detail::out_of_range::create(404, detail::concat("unresolved reference token '", reference_token, "'"), ptr));
            }
        }

        return *ptr;
    }